

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O3

void __thiscall dg::vr::AllocatedArea::AllocatedArea(AllocatedArea *this,CallInst *call)

{
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  uint64_t uVar2;
  long lVar3;
  const_iterator cVar4;
  uint64_t *puVar5;
  undefined1 auVar6 [16];
  AnalysisOptions options;
  key_type local_78;
  AnalysisOptions local_58;
  
  this->ptr = (Value *)call;
  this->reallocatedPtr = (Value *)0x0;
  (this->originalSizeView).elementCount = (Value *)0x0;
  (this->originalSizeView).elementSize = 0;
  auVar6 = llvm::Value::getName();
  lVar3 = auVar6._0_8_;
  if (lVar3 == 0) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,lVar3,auVar6._8_8_ + lVar3);
  }
  AnalysisOptions::AnalysisOptions(&local_58);
  this_00 = &local_58.allocationFunctions;
  cVar4 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
          ::find(&this_00->_M_t,&local_78);
  p_Var1 = &local_58.allocationFunctions._M_t._M_impl.super__Rb_tree_header;
  if ((((_Rb_tree_header *)cVar4._M_node != p_Var1) && (cVar4._M_node[2]._M_color == 3)) ||
     ((cVar4 = std::
               _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
               ::find(&this_00->_M_t,&local_78), (_Rb_tree_header *)cVar4._M_node != p_Var1 &&
      (cVar4._M_node[2]._M_color == _S_black)))) {
    (this->originalSizeView).elementCount =
         *(Value **)(call + -(ulong)(uint)(*(int *)(call + 0x14) << 5));
    (this->originalSizeView).elementSize = 1;
  }
  cVar4 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
          ::find(&this_00->_M_t,&local_78);
  if (((_Rb_tree_header *)cVar4._M_node != p_Var1) && (cVar4._M_node[2]._M_color == 2)) {
    lVar3 = *(long *)(call + -(ulong)(uint)(*(int *)(call + 0x14) << 5) + 0x20);
    if (*(uint *)(lVar3 + 0x20) < 0x41) {
      puVar5 = (uint64_t *)(lVar3 + 0x18);
    }
    else {
      puVar5 = *(uint64_t **)(lVar3 + 0x18);
    }
    uVar2 = *puVar5;
    (this->originalSizeView).elementCount =
         *(Value **)(call + -(ulong)(uint)(*(int *)(call + 0x14) << 5));
    (this->originalSizeView).elementSize = uVar2;
  }
  cVar4 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
          ::find(&this_00->_M_t,&local_78);
  if (((_Rb_tree_header *)cVar4._M_node != p_Var1) && (cVar4._M_node[2]._M_color == 4)) {
    (this->originalSizeView).elementCount =
         *(Value **)(call + -(ulong)(uint)(*(int *)(call + 0x14) << 5));
    (this->originalSizeView).elementSize = 1;
    this->reallocatedPtr = *(Value **)(call + -(ulong)(uint)(*(int *)(call + 0x14) << 5));
  }
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&this_00->_M_t,
             (_Link_type)
             local_58.allocationFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

AllocatedArea::AllocatedArea(const llvm::CallInst *call) : ptr(call) {
    const std::string &name = call->getCalledFunction()->getName().str();
    AnalysisOptions options;

    if (options.getAllocationFunction(name) == AllocationFunction::ALLOCA ||
        options.getAllocationFunction(name) == AllocationFunction::MALLOC) {
        originalSizeView = AllocatedSizeView(call->getOperand(0), 1);
    }

    if (options.getAllocationFunction(name) == AllocationFunction::CALLOC) {
        const auto *size = llvm::cast<llvm::ConstantInt>(call->getOperand(1));
        originalSizeView =
                AllocatedSizeView(call->getOperand(0), size->getZExtValue());
    }

    if (options.getAllocationFunction(name) == AllocationFunction::REALLOC) {
        originalSizeView = AllocatedSizeView(call->getOperand(0), 1);
        reallocatedPtr = call->getOperand(0);
    }
}